

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner_test.cc
# Opt level: O0

void __thiscall
AwsCommandRunner_SyncDirectory_Test::TestBody(AwsCommandRunner_SyncDirectory_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *pMVar2;
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *pTVar3;
  MockSpec<bool_()> *pMVar4;
  TypedExpectation<bool_()> *pTVar5;
  char *pcVar6;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7e8;
  string local_780;
  AssertHelper local_760;
  Message local_758;
  bool local_749;
  undefined1 local_748 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_718;
  Message local_710;
  bool local_701;
  undefined1 local_700 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_6d0;
  Message local_6c8;
  bool local_6b9;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_688;
  Message local_680;
  bool local_671;
  undefined1 local_670 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_640;
  Message local_638;
  bool local_629;
  undefined1 local_628 [8];
  AssertionResult gtest_ar__1;
  string local_610;
  AssertHelper local_5f0;
  Message local_5e8;
  bool local_5d9;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_;
  string local_5c0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_59d;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_59c;
  undefined1 local_59b;
  allocator local_59a;
  allocator local_599;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  string local_570 [32];
  iterator local_550;
  size_type local_548;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_540;
  allocator local_509;
  string local_508;
  allocator local_4e1;
  string local_4e0;
  undefined1 local_4c0 [8];
  AwsCommandRunner aws_command_runner;
  Action<bool_()> local_438;
  ReturnAction<bool> local_428;
  Action<bool_()> local_418;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_404;
  undefined1 local_403;
  allocator local_402;
  allocator local_401;
  allocator local_400;
  allocator local_3ff;
  allocator local_3fe;
  allocator local_3fd;
  allocator local_3fc;
  allocator local_3fb;
  allocator local_3fa;
  allocator local_3f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  iterator local_2b0;
  size_type local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_288;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_26e;
  undefined1 local_26d;
  allocator local_26c;
  allocator local_26b;
  allocator local_26a;
  allocator local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  iterator local_1e0;
  size_type local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_1b8;
  undefined1 local_190 [8];
  MultipleCommandRunner multiple_command_runner;
  MockCommandRunner command_runner;
  AwsCommandRunner_SyncDirectory_Test *this_local;
  
  anon_unknown.dwarf_e710::MockCommandRunner::MockCommandRunner
            ((MockCommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  MultipleCommandRunner::MultipleCommandRunner
            ((MultipleCommandRunner *)local_190,
             (CommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  local_26d = 1;
  local_268 = &local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,"aws",&local_269);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"s3",&local_26a);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"rm",&local_26b);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"s3://bucket/foo",&local_26c);
  local_26d = 0;
  local_1e0 = &local_260;
  local_1d8 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_26e);
  __l_01._M_len = local_1d8;
  __l_01._M_array = local_1e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1d0,__l_01,&local_26e);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::Matcher(&local_1b8,&local_1d0);
  pMVar2 = anon_unknown.dwarf_e710::MockCommandRunner::gmock_RunCommand
                     ((MockCommandRunner *)
                      &multiple_command_runner.ignore_failures_for_current_command_,&local_1b8);
  pTVar3 = testing::internal::
           MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x58,"command_runner",
                      "RunCommand(std::vector<std::string>({ \"aws\", \"s3\", \"rm\", \"s3://bucket/foo\", }))"
                     );
  testing::internal::
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::Times(pTVar3,1);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~Matcher(&local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_26e);
  local_7e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0;
  do {
    local_7e8 = local_7e8 + -1;
    std::__cxx11::string::~string((string *)local_7e8);
  } while (local_7e8 != &local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_26c);
  std::allocator<char>::~allocator((allocator<char> *)&local_26b);
  std::allocator<char>::~allocator((allocator<char> *)&local_26a);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  local_403 = 1;
  local_3f8 = &local_3f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"aws",&local_3f9);
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"s3",&local_3fa);
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"sync",&local_3fb);
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"--delete",&local_3fc);
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"--exclude",&local_3fd);
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"*.jpg",&local_3fe);
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"--exclude",&local_3ff);
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"*.mp3",&local_400);
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"/tmp/foo",&local_401);
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"s3://bucket/foo",&local_402);
  local_403 = 0;
  local_2b0 = &local_3f0;
  local_2a8 = 10;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_404);
  __l_00._M_len = local_2a8;
  __l_00._M_array = local_2b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2a0,__l_00,&local_404);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::Matcher(&local_288,&local_2a0);
  pMVar2 = anon_unknown.dwarf_e710::MockCommandRunner::gmock_RunCommand
                     ((MockCommandRunner *)
                      &multiple_command_runner.ignore_failures_for_current_command_,&local_288);
  pTVar3 = testing::internal::
           MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x5e,"command_runner",
                      "RunCommand(std::vector<std::string>({ \"aws\", \"s3\", \"sync\", \"--delete\", \"--exclude\", \"*.jpg\", \"--exclude\", \"*.mp3\", \"/tmp/foo\", \"s3://bucket/foo\", }))"
                     );
  testing::internal::
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::Times(pTVar3,1);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~Matcher(&local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_404);
  local_8b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b0;
  do {
    local_8b8 = local_8b8 + -1;
    std::__cxx11::string::~string((string *)local_8b8);
  } while (local_8b8 != &local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_402);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::allocator<char>::~allocator((allocator<char> *)&local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_3ff);
  std::allocator<char>::~allocator((allocator<char> *)&local_3fe);
  std::allocator<char>::~allocator((allocator<char> *)&local_3fd);
  std::allocator<char>::~allocator((allocator<char> *)&local_3fc);
  std::allocator<char>::~allocator((allocator<char> *)&local_3fb);
  std::allocator<char>::~allocator((allocator<char> *)&local_3fa);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  pMVar4 = anon_unknown.dwarf_e710::MockCommandRunner::gmock_Finished
                     ((MockCommandRunner *)
                      &multiple_command_runner.ignore_failures_for_current_command_);
  pTVar5 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x60,"command_runner","Finished()");
  testing::Return<bool>((testing *)&local_428,true);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_418);
  testing::internal::TypedExpectation<bool_()>::WillRepeatedly(pTVar5,&local_418);
  testing::Action<bool_()>::~Action(&local_418);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_428);
  pMVar4 = anon_unknown.dwarf_e710::MockCommandRunner::gmock_PreviousCommandFailed
                     ((MockCommandRunner *)
                      &multiple_command_runner.ignore_failures_for_current_command_);
  pTVar5 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x61,"command_runner","PreviousCommandFailed()");
  testing::Return<bool>
            ((testing *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             false);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_438);
  testing::internal::TypedExpectation<bool_()>::WillRepeatedly(pTVar5,&local_438);
  testing::Action<bool_()>::~Action(&local_438);
  testing::internal::ReturnAction<bool>::~ReturnAction
            ((ReturnAction<bool> *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e0,"/tmp/",&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_508,"bucket",&local_509);
  local_59b = 1;
  local_598 = &local_590;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_590,"*.jpg",&local_599);
  local_598 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"*.mp3",&local_59a);
  local_59b = 0;
  local_550 = &local_590;
  local_548 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_59d);
  __l._M_len = local_548;
  __l._M_array = local_550;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_540,__l,&local_59c,&local_59d);
  AwsCommandRunner::AwsCommandRunner
            ((AwsCommandRunner *)local_4c0,(MultipleCommandRunner *)local_190,&local_4e0,&local_508,
             &local_540);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_540);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_59d);
  local_928 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_550;
  do {
    local_928 = local_928 + -1;
    std::__cxx11::string::~string((string *)local_928);
  } while (local_928 != &local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_59a);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5c0,"/tmp/foo",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  AwsCommandRunner::SyncDirectory((AwsCommandRunner *)local_4c0,&local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  bVar1 = AwsCommandRunner::Finished((AwsCommandRunner *)local_4c0);
  local_5d9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5d8,&local_5d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar1) {
    testing::Message::Message(&local_5e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_610,(internal *)local_5d8,(AssertionResult *)"aws_command_runner.Finished()",
               "true","false",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
               ,0x68,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper(&local_5f0);
    std::__cxx11::string::~string((string *)&local_610);
    testing::Message::~Message(&local_5e8);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    bVar1 = AwsCommandRunner::PreviousCommandFailed((AwsCommandRunner *)local_4c0);
    local_629 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_628,&local_629,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
    if (!bVar1) {
      testing::Message::Message(&local_638);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_628,
                 (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true","false",
                 in_R9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_640,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                 ,0x69,pcVar6);
      testing::internal::AssertHelper::operator=(&local_640,&local_638);
      testing::internal::AssertHelper::~AssertHelper(&local_640);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_638);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      bVar1 = AwsCommandRunner::Finished((AwsCommandRunner *)local_4c0);
      local_671 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_670,&local_671,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
      if (!bVar1) {
        testing::Message::Message(&local_680);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_670,
                   (AssertionResult *)"aws_command_runner.Finished()","true","false",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_688,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                   ,0x6a,pcVar6);
        testing::internal::AssertHelper::operator=(&local_688,&local_680);
        testing::internal::AssertHelper::~AssertHelper(&local_688);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_680);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        bVar1 = AwsCommandRunner::PreviousCommandFailed((AwsCommandRunner *)local_4c0);
        local_6b9 = (bool)(~bVar1 & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_6b8,&local_6b9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
        if (!bVar1) {
          testing::Message::Message(&local_6c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_6b8,
                     (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true","false",
                     in_R9);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_6d0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                     ,0x6b,pcVar6);
          testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
          testing::internal::AssertHelper::~AssertHelper(&local_6d0);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_6c8);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
          local_701 = AwsCommandRunner::Finished((AwsCommandRunner *)local_4c0);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_700,&local_701,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
          if (!bVar1) {
            testing::Message::Message(&local_710);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_700,
                       (AssertionResult *)"aws_command_runner.Finished()","false","true",in_R9);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_718,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                       ,0x6c,pcVar6);
            testing::internal::AssertHelper::operator=(&local_718,&local_710);
            testing::internal::AssertHelper::~AssertHelper(&local_718);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_710);
          }
          gtest_ar__1.message_.ptr_._5_3_ = 0;
          gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
            bVar1 = AwsCommandRunner::PreviousCommandFailed((AwsCommandRunner *)local_4c0);
            local_749 = (bool)(~bVar1 & 1);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_748,&local_749,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
            if (!bVar1) {
              testing::Message::Message(&local_758);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_780,(internal *)local_748,
                         (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true",
                         "false",in_R9);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_760,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                         ,0x6d,pcVar6);
              testing::internal::AssertHelper::operator=(&local_760,&local_758);
              testing::internal::AssertHelper::~AssertHelper(&local_760);
              std::__cxx11::string::~string((string *)&local_780);
              testing::Message::~Message(&local_758);
            }
            gtest_ar__1.message_.ptr_._5_3_ = 0;
            gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
              gtest_ar__1.message_.ptr_._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  AwsCommandRunner::~AwsCommandRunner((AwsCommandRunner *)local_4c0);
  MultipleCommandRunner::~MultipleCommandRunner((MultipleCommandRunner *)local_190);
  anon_unknown.dwarf_e710::MockCommandRunner::~MockCommandRunner
            ((MockCommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  return;
}

Assistant:

TEST(AwsCommandRunner, SyncDirectory) {
  MockCommandRunner command_runner;
  MultipleCommandRunner multiple_command_runner(&command_runner);
  EXPECT_CALL(command_runner, RunCommand(std::vector<std::string>({
                                  "aws", "s3", "rm", "s3://bucket/foo",
                              })))
      .Times(1);
  EXPECT_CALL(command_runner,
              RunCommand(std::vector<std::string>({
                  "aws", "s3", "sync", "--delete", "--exclude", "*.jpg",
                  "--exclude", "*.mp3", "/tmp/foo", "s3://bucket/foo",
              })))
      .Times(1);
  EXPECT_CALL(command_runner, Finished()).WillRepeatedly(Return(true));
  EXPECT_CALL(command_runner, PreviousCommandFailed())
      .WillRepeatedly(Return(false));

  AwsCommandRunner aws_command_runner(&multiple_command_runner, "/tmp/",
                                      "bucket", {"*.jpg", "*.mp3"});
  aws_command_runner.SyncDirectory("/tmp/foo");

  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_TRUE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
}